

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

void CameraMoveForward(Camera *camera,float distance,_Bool moveInWorldPlane)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined3 in_register_00000031;
  Vector3 VVar6;
  float fVar5;
  
  VVar6 = GetCameraForward(camera);
  fVar5 = VVar6.y;
  if (CONCAT31(in_register_00000031,moveInWorldPlane) != 0) {
    VVar6.y = 0.0;
    VVar6 = Vector3Normalize(VVar6);
    fVar5 = VVar6.y;
  }
  uVar1 = (camera->position).x;
  uVar3 = (camera->position).y;
  uVar2 = (camera->target).x;
  uVar4 = (camera->target).y;
  (camera->position).x = (float)uVar1 + distance * VVar6.x;
  (camera->position).y = (float)uVar3 + distance * fVar5;
  (camera->position).z = (camera->position).z + VVar6.z * distance;
  (camera->target).x = (float)uVar2 + distance * VVar6.x;
  (camera->target).y = (float)uVar4 + distance * fVar5;
  (camera->target).z = VVar6.z * distance + (camera->target).z;
  return;
}

Assistant:

void CameraMoveForward(Camera *camera, float distance, bool moveInWorldPlane)
{
    Vector3 forward = GetCameraForward(camera);

    if (moveInWorldPlane)
    {
        // Project vector onto world plane
        forward.y = 0;
        forward = Vector3Normalize(forward);
    }

    // Scale by distance
    forward = Vector3Scale(forward, distance);

    // Move position and target
    camera->position = Vector3Add(camera->position, forward);
    camera->target = Vector3Add(camera->target, forward);
}